

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_V5_MeshDoubleVertices::Transform(ON_V5_MeshDoubleVertices *this,ON_Xform *xform)

{
  bool bVar1;
  ON__UINT32 OVar2;
  ON__UINT32 OVar3;
  
  bVar1 = ON_Xform::IsIdentity(xform,0.0);
  if (!bVar1) {
    OVar2 = ON_CRC32(0,(long)(this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_count * 0x18,
                     (this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_a);
    ON_3dPointArray::Transform(&this->m_V5_dV,xform);
    OVar3 = ON_CRC32(0,(long)(this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_count * 0x18,
                     (this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_a);
    if ((OVar2 != this->m_dCRC) ||
       ((this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_count != this->m_dcount)) {
      OVar3 = (ON__UINT32)(OVar3 == 0);
    }
    this->m_dCRC = OVar3;
  }
  return true;
}

Assistant:

bool ON_V5_MeshDoubleVertices::Transform( const ON_Xform& xform )
{
  if ( !xform.IsIdentity() )
  {
    const ON__UINT32 crc0 = DoubleCRC();
    m_V5_dV.Transform(xform);
    const ON__UINT32 crc1 = DoubleCRC();
    if ( crc0 == m_dCRC && m_V5_dV.Count() == m_dcount )
      m_dCRC = crc1; // update m_dCRC so it stays valid
    else
      m_dCRC = (0==crc1)?1:0; // make sure m_dCRC is not valid
  }
  return true;
}